

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint * crnlib::rg_etc1::indirect_radix_sort<unsigned_int,unsigned_short>
                 (uint num_indices,uint *pIndices0,uint *pIndices1,unsigned_short *pKeys,
                 uint key_ofs,uint key_size,bool init_indices)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  uint *t;
  uint dst_offset;
  uint c;
  uint index;
  uint dst_offset1;
  uint dst_offset0_1;
  uint dst_offset0;
  uint c1;
  uint c0;
  uint index1;
  uint index0;
  uint *q_5;
  uint *p_5;
  uint local_14f0;
  uint pass_shift;
  uint i_1;
  uint cur_ofs;
  uint offsets [256];
  uint *pHist;
  uint *puStack_10d8;
  uint pass;
  uint *pNew;
  uint *pCur;
  uint key_3;
  uint key1_1;
  uint key0_1;
  uint *q_4;
  uint *p_4;
  uint key_2;
  uint key1;
  uint key0;
  uint *q_3;
  uint *p_3;
  uint key_1;
  uint *q_2;
  uint *p_2;
  uint key;
  uint *q_1;
  uint *p_1;
  uint hist [1024];
  uint i;
  uint *q;
  uint *p;
  bool init_indices_local;
  uint key_size_local;
  uint key_ofs_local;
  unsigned_short *pKeys_local;
  uint *pIndices1_local;
  uint *pIndices0_local;
  uint num_indices_local;
  
  if (init_indices) {
    hist[0x3ff] = 0;
    for (q = pIndices0; q != pIndices0 + (num_indices & 0xfffffffe); q = q + 2) {
      *q = hist[0x3ff];
      q[1] = hist[0x3ff] + 1;
      hist[0x3ff] = hist[0x3ff] + 2;
    }
    if ((num_indices & 1) != 0) {
      *q = hist[0x3ff];
    }
  }
  memset(&p_1,0,(ulong)key_size << 10);
  if (key_size == 4) {
    for (q_1 = pIndices0; q_1 != pIndices0 + num_indices; q_1 = q_1 + 1) {
      uVar1 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_1 * 2);
      hist[(ulong)(uVar1 & 0xff) - 2] = hist[(ulong)(uVar1 & 0xff) - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 8 & 0xff) + 0x100);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 0x10 & 0xff) + 0x200);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 0x18) + 0x300);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
  }
  else if (key_size == 3) {
    for (q_2 = pIndices0; q_2 != pIndices0 + num_indices; q_2 = q_2 + 1) {
      uVar1 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_2 * 2);
      hist[(ulong)(uVar1 & 0xff) - 2] = hist[(ulong)(uVar1 & 0xff) - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 8 & 0xff) + 0x100);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 0x10 & 0xff) + 0x200);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
  }
  else if (key_size == 2) {
    for (q_3 = pIndices0; q_3 != pIndices0 + (num_indices & 0xfffffffe); q_3 = q_3 + 2) {
      uVar1 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_3 * 2);
      uVar2 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)q_3[1] * 2);
      uVar8 = (ulong)(uVar1 & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 8 & 0xff) + 0x100);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)(uVar2 & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar2 >> 8 & 0xff) + 0x100);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
    if ((num_indices & 1) != 0) {
      uVar1 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_3 * 2);
      uVar8 = (ulong)(uVar1 & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)((uVar1 >> 8 & 0xff) + 0x100);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
  }
  else {
    if (key_size != 1) {
      return (uint *)0x0;
    }
    for (q_4 = pIndices0; q_4 != pIndices0 + (num_indices & 0xfffffffe); q_4 = q_4 + 2) {
      uVar1 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)q_4[1] * 2);
      uVar8 = (ulong)(*(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_4 * 2) & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
      uVar8 = (ulong)(uVar1 & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
    if ((num_indices & 1) != 0) {
      uVar8 = (ulong)(*(uint *)((long)pKeys + (ulong)key_ofs + (ulong)*q_4 * 2) & 0xff);
      hist[uVar8 - 2] = hist[uVar8 - 2] + 1;
    }
  }
  puStack_10d8 = pIndices1;
  pNew = pIndices0;
  for (pHist._4_4_ = 0; pHist._4_4_ < key_size; pHist._4_4_ = pHist._4_4_ + 1) {
    offsets._1016_8_ = hist + ((ulong)(pHist._4_4_ << 8) - 2);
    pass_shift = 0;
    for (local_14f0 = 0; local_14f0 < 0x100; local_14f0 = local_14f0 + 2) {
      (&i_1)[local_14f0] = pass_shift;
      uVar5 = *(int *)(offsets._1016_8_ + (ulong)local_14f0 * 4) + pass_shift;
      (&i_1)[local_14f0 + 1] = uVar5;
      pass_shift = *(int *)(offsets._1016_8_ + (ulong)(local_14f0 + 1) * 4) + uVar5;
    }
    for (q_5 = pNew; bVar9 = (byte)(pHist._4_4_ << 3), q_5 != pNew + (num_indices & 0xfffffffe);
        q_5 = q_5 + 2) {
      uVar1 = *q_5;
      uVar2 = q_5[1];
      uVar6 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)uVar1 * 2) >> (bVar9 & 0x1f) & 0xff;
      uVar7 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)uVar2 * 2) >> (bVar9 & 0x1f) & 0xff;
      if (uVar6 == uVar7) {
        uVar7 = (&i_1)[uVar6];
        (&i_1)[uVar6] = uVar7 + 2;
        puStack_10d8[uVar7] = uVar1;
        puStack_10d8[uVar7 + 1] = uVar2;
      }
      else {
        uVar3 = (&i_1)[uVar6];
        (&i_1)[uVar6] = uVar3 + 1;
        uVar6 = (&i_1)[uVar7];
        (&i_1)[uVar7] = uVar6 + 1;
        puStack_10d8[uVar3] = uVar1;
        puStack_10d8[uVar6] = uVar2;
      }
    }
    if ((num_indices & 1) != 0) {
      uVar1 = *q_5;
      uVar6 = *(uint *)((long)pKeys + (ulong)key_ofs + (ulong)uVar1 * 2) >> (bVar9 & 0x1f) & 0xff;
      uVar2 = (&i_1)[uVar6];
      (&i_1)[uVar6] = uVar2 + 1;
      puStack_10d8[uVar2] = uVar1;
    }
    puVar4 = puStack_10d8;
    puStack_10d8 = pNew;
    pNew = puVar4;
  }
  return pNew;
}

Assistant:

T* indirect_radix_sort(uint num_indices, T* pIndices0, T* pIndices1, const Q* pKeys, uint key_ofs, uint key_size, bool init_indices) {
  RG_ETC1_ASSERT((key_ofs >= 0) && (key_ofs < sizeof(T)));
  RG_ETC1_ASSERT((key_size >= 1) && (key_size <= 4));

  if (init_indices) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;
    uint i;
    for (i = 0; p != q; p += 2, i += 2) {
      p[0] = static_cast<T>(i);
      p[1] = static_cast<T>(i + 1);
    }

    if (num_indices & 1)
      *p = static_cast<T>(i);
  }

  uint hist[256 * 4];

  memset(hist, 0, sizeof(hist[0]) * 256 * key_size);

#define RG_ETC1_GET_KEY(p) (*(const uint*)((const uint8*)(pKeys + *(p)) + key_ofs))
#define RG_ETC1_GET_KEY_FROM_INDEX(i) (*(const uint*)((const uint8*)(pKeys + (i)) + key_ofs))

  if (key_size == 4) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = RG_ETC1_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
      hist[768 + ((key >> 24) & 0xFF)]++;
    }
  } else if (key_size == 3) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = RG_ETC1_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
    }
  } else if (key_size == 2) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = RG_ETC1_GET_KEY(p);
      const uint key1 = RG_ETC1_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[256 + ((key0 >> 8) & 0xFF)]++;

      hist[key1 & 0xFF]++;
      hist[256 + ((key1 >> 8) & 0xFF)]++;
    }

    if (num_indices & 1) {
      const uint key = RG_ETC1_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
    }
  } else {
    RG_ETC1_ASSERT(key_size == 1);
    if (key_size != 1)
      return NULL;

    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = RG_ETC1_GET_KEY(p);
      const uint key1 = RG_ETC1_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[key1 & 0xFF]++;
    }

    if (num_indices & 1) {
      const uint key = RG_ETC1_GET_KEY(p);

      hist[key & 0xFF]++;
    }
  }

  T* pCur = pIndices0;
  T* pNew = pIndices1;

  for (uint pass = 0; pass < key_size; pass++) {
    const uint* pHist = &hist[pass << 8];

    uint offsets[256];

    uint cur_ofs = 0;
    for (uint i = 0; i < 256; i += 2) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];

      offsets[i + 1] = cur_ofs;
      cur_ofs += pHist[i + 1];
    }

    const uint pass_shift = pass << 3;

    T* p = pCur;
    T* q = pCur + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      uint index0 = p[0];
      uint index1 = p[1];

      uint c0 = (RG_ETC1_GET_KEY_FROM_INDEX(index0) >> pass_shift) & 0xFF;
      uint c1 = (RG_ETC1_GET_KEY_FROM_INDEX(index1) >> pass_shift) & 0xFF;

      if (c0 == c1) {
        uint dst_offset0 = offsets[c0];

        offsets[c0] = dst_offset0 + 2;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset0 + 1] = static_cast<T>(index1);
      } else {
        uint dst_offset0 = offsets[c0]++;
        uint dst_offset1 = offsets[c1]++;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset1] = static_cast<T>(index1);
      }
    }

    if (num_indices & 1) {
      uint index = *p;
      uint c = (RG_ETC1_GET_KEY_FROM_INDEX(index) >> pass_shift) & 0xFF;

      uint dst_offset = offsets[c];
      offsets[c] = dst_offset + 1;

      pNew[dst_offset] = static_cast<T>(index);
    }

    T* t = pCur;
    pCur = pNew;
    pNew = t;
  }

  return pCur;
}